

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O2

void UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  int iVar1;
  UBool useFallback;
  uint8_t uVar2;
  char cVar3;
  UChar UVar4;
  UConverter *pUVar5;
  uint8_t *puVar6;
  UChar *pUVar7;
  void *pvVar8;
  UConverter *pUVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint8_t *puVar17;
  long lVar18;
  UChar *pUVar19;
  uint8_t *puVar20;
  uint c;
  uint local_60;
  uint32_t pValue;
  uint8_t tmpTargetBuffer [7];
  
  pUVar5 = args->converter;
  pUVar19 = args->source;
  puVar20 = (uint8_t *)args->target;
  puVar6 = (uint8_t *)args->targetLimit;
  pUVar7 = args->sourceLimit;
  useFallback = pUVar5->useFallback;
  pvVar8 = pUVar5->extraInfo;
  local_60 = *(uint *)((long)pvVar8 + 0xa0);
  c = pUVar5->fromUChar32;
  puVar17 = puVar20;
  if (c != 0 && puVar20 < puVar6) goto LAB_00163b3a;
  do {
    if (pUVar7 <= pUVar19) {
LAB_00163ecd:
      *(uint *)((long)pvVar8 + 0xa0) = local_60;
      args->source = pUVar19;
      args->target = (char *)puVar20;
      return;
    }
    if (puVar6 <= puVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_00163ecd;
    }
    UVar4 = *pUVar19;
    c = (uint)(ushort)UVar4;
    pUVar19 = pUVar19 + 1;
    puVar17 = puVar20;
    if ((c & 0xf800) == 0xd800) {
      if (((ushort)UVar4 >> 10 & 1) == 0) {
LAB_00163b3a:
        puVar20 = puVar17;
        if (pUVar19 < pUVar7) {
          UVar4 = *pUVar19;
          if (((ushort)UVar4 & 0xfc00) == 0xdc00) {
            pUVar19 = pUVar19 + 1;
            c = c * 0x400 + (uint)(ushort)UVar4 + 0xfca02400;
            pUVar5->fromUChar32 = 0;
            goto LAB_00163b76;
          }
          goto LAB_00163eac;
        }
      }
      else {
LAB_00163eac:
        *err = U_ILLEGAL_CHAR_FOUND;
        puVar20 = puVar17;
      }
      pUVar5->fromUChar32 = c;
      goto LAB_00163ecd;
    }
LAB_00163b76:
    uVar10 = 0;
    if (((10 < c) || ((0x601U >> (c & 0x1f) & 1) == 0)) && (0x5f < (c & 0xffffff60) - 0x20)) {
      uVar10 = 0x10;
      if ((((((0xf < c - 0x102) || ((0xfc3fU >> (c - 0x102 & 0x1f) & 1) == 0)) &&
            ((uVar13 = c & 0xfffffffc, uVar13 != 0x118 && (1 < (c & 0xfffffffb) - 0x139)))) &&
           ((0x14 < c - 0x141 || ((0x19804fU >> (c - 0x141 & 0x1f) & 1) == 0)))) &&
          (uVar16 = c & 0xfffffffe, uVar16 != 0x15e && uVar13 != 0x158)) &&
         ((((0x1e < c - 0x160 || ((0x7e03c03fU >> (c - 0x160 & 0x1f) & 1) == 0)) &&
           ((0x16 < c - 0x2c7 || ((0x560001U >> (c - 0x2c7 & 0x1f) & 1) == 0)))) &&
          (uVar10 = 0x11, uVar13 != 0x108)))) {
        if (c - 0x11c < 6) {
          if (uVar13 != 0x124 && (0x33U >> ((byte)(c - 0x11c) & 0x1f) & 1) == 0) {
LAB_00163eff:
            if (((((0x39 < c - 0x134) ||
                  ((0x300030000000003U >> ((ulong)(c - 0x134) & 0x3f) & 1) == 0)) &&
                 (uVar10 = 0x12, uVar13 != 0x174)) &&
                ((0x2f < c - 0x1e56 || ((0xfc0000300c03U >> ((ulong)(c - 0x1e56) & 0x3f) & 1) == 0))
                )) && ((0x37 < c - 0x1e0a ||
                       ((0xc0000000300003U >> ((ulong)(c - 0x1e0a) & 0x3f) & 1) == 0)))) {
              if ((c - 0x152 < 0x27) && ((0x4000000003U >> ((ulong)(c - 0x152) & 0x3f) & 1) != 0)) {
LAB_00163fc2:
                uVar10 = 0x13;
              }
              else if (1 < c - 0x1ef2) {
                if (c == 0x20ac) goto LAB_00163fc2;
                uVar10 = 0xf;
                if (0x1c < c - 0xe3f && 0x39 < c - 0xe01) {
                  uVar10 = 0xe;
                  if ((((0x23 < c - 0x100) ||
                       ((0xc00cc0003U >> ((ulong)(c - 0x100) & 0x3f) & 1) == 0)) &&
                      (uVar16 != 0x12e && uVar13 != 0x128)) &&
                     (((0x3d < c - 0x136 ||
                       ((0x303f000300f18067U >> ((ulong)(c - 0x136) & 0x3f) & 1) == 0)) &&
                      ((uVar10 = 2, uVar16 != 700 && (c != 0x2015 && 0x4a < c - 900)))))) {
                    uVar10 = 3;
                    if (((0x13 < c - 0x60c) || ((0x88001U >> (c - 0x60c & 0x1f) & 1) == 0)) &&
                       ((0x12 < c - 0x640 && 0x19 < c - 0x621 && (c != 0x200b && 0xd < c - 0x660))))
                    {
                      if (c - 0xfe70 < 5) {
                        if ((0x48 < c - 0xfe76 & (0x17U >> ((byte)(c - 0xfe70) & 0x1f) ^ 1)) != 0) {
LAB_001641b0:
                          uVar10 = 0xd;
                          if ((((0x1a < c - 0x5d0) && (c != 0x2017)) && (c != 0x203e)) &&
                             (uVar10 = 0xc, c != 0x2116 && 0x5e < c - 0x401)) {
                            uVar10 = 1;
                            if (((0x13 < c - 0x11e) || ((0xc0003U >> (c - 0x11e & 0x1f) & 1) == 0))
                               && (uVar15 = 0, uVar13 != 0x218)) goto LAB_00163be5;
                          }
                        }
                      }
                      else if (0x48 < c - 0xfe76) goto LAB_001641b0;
                    }
                  }
                }
              }
            }
          }
        }
        else if (uVar13 != 0x124) goto LAB_00163eff;
      }
    }
    uVar15 = 0;
    if (local_60 != uVar10) {
      for (uVar15 = 0; local_60 = uVar10, escSeqCompoundText[uVar10][uVar15] != '\0';
          uVar15 = uVar15 + 1) {
        tmpTargetBuffer[uVar15] = escSeqCompoundText[uVar10][uVar15];
      }
    }
    uVar12 = uVar15 & 0xffffffff;
    if (local_60 == 0) {
      uVar15 = (ulong)((int)uVar15 + 1);
      tmpTargetBuffer[uVar12] = (uint8_t)c;
    }
    else {
      if (local_60 == 0xffffffff) {
LAB_00163be5:
        puVar20 = escSeqCompoundText[1];
        lVar18 = -0xb;
LAB_00163bf5:
        if (lVar18 != 0) {
          iVar11 = ucnv_MBCSFromUChar32_63
                             (*(UConverterSharedData **)((long)pvVar8 + lVar18 * 8 + 0x60),c,&pValue
                              ,useFallback);
          if (iVar11 < 1) break;
          if ((int)lVar18 - local_60 != -0xc) {
            local_60 = (int)lVar18 + 0xc;
            uVar15 = uVar15 & 0xffffffff;
            for (; *puVar20 != '\0'; puVar20 = puVar20 + 1) {
              tmpTargetBuffer[uVar15] = *puVar20;
              uVar15 = uVar15 + 1;
            }
          }
          uVar15 = uVar15 & 0xffffffff;
          iVar1 = iVar11 * 8;
          for (; iVar1 = iVar1 + -8, 0 < iVar11; iVar11 = iVar11 + -1) {
            tmpTargetBuffer[uVar15] = (uint8_t)(pValue >> ((byte)iVar1 & 0x1f));
            uVar15 = uVar15 + 1;
          }
        }
        goto LAB_00163dde;
      }
      iVar11 = ucnv_MBCSFromUChar32_63
                         (*(UConverterSharedData **)((long)pvVar8 + (long)(int)local_60 * 8),c,
                          &pValue,useFallback);
      if (0 < iVar11) {
        iVar1 = iVar11 * 8;
        for (; iVar1 = iVar1 + -8, 0 < iVar11; iVar11 = iVar11 + -1) {
          tmpTargetBuffer[uVar12] = (uint8_t)(pValue >> ((byte)iVar1 & 0x1f));
          uVar12 = uVar12 + 1;
        }
        uVar15 = uVar12 & 0xffffffff;
      }
    }
LAB_00163dde:
    uVar14 = 0;
    uVar12 = 0;
    if (0 < (int)uVar15) {
      uVar12 = uVar15 & 0xffffffff;
    }
    for (; puVar20 = puVar17 + uVar14, uVar12 != uVar14; uVar14 = uVar14 + 1) {
      if (puVar6 <= puVar20) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        uVar12 = uVar14;
        goto LAB_00163e25;
      }
      *puVar20 = tmpTargetBuffer[uVar14];
    }
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
LAB_00163e25:
      for (; (long)uVar12 < (long)(int)uVar15; uVar12 = uVar12 + 1) {
        uVar2 = tmpTargetBuffer[uVar12];
        pUVar9 = args->converter;
        cVar3 = pUVar9->charErrorBufferLength;
        pUVar9->charErrorBufferLength = cVar3 + '\x01';
        pUVar9->charErrorBuffer[cVar3] = uVar2;
      }
    }
  } while( true );
  puVar20 = puVar20 + 5;
  lVar18 = lVar18 + 1;
  goto LAB_00163bf5;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    /* int32_t* offsets = args->offsets; */
    UChar32 sourceChar;
    UBool useFallback = cnv->useFallback;
    uint8_t tmpTargetBuffer[7];
    int32_t tmpTargetBufferLength = 0;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    uint32_t pValue;
    int32_t pValueLength = 0;
    int32_t i, n, j;

    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) cnv->extraInfo;

    currentState = myConverterData->state;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

             tmpTargetBufferLength = 0;
             tmpState = getState(sourceChar);

             if (tmpState != DO_SEARCH && currentState != tmpState) {
                 /* Get escape sequence if necessary */
                 currentState = tmpState;
                 for (i = 0; escSeqCompoundText[currentState][i] != 0; i++) {
                     tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][i];
                 }
             }

             if (tmpState == DO_SEARCH) {
                 /* Test all available converters */
                 for (i = 1; i < SEARCH_LENGTH; i++) {
                     pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[i], sourceChar, &pValue, useFallback);
                     if (pValueLength > 0) {
                         tmpState = (COMPOUND_TEXT_CONVERTERS)i;
                         if (currentState != tmpState) {
                             currentState = tmpState;
                             for (j = 0; escSeqCompoundText[currentState][j] != 0; j++) {
                                 tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][j];
                             }
                         }
                         for (n = (pValueLength - 1); n >= 0; n--) {
                             tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                         }
                         break;
                     }
                 }
             } else if (tmpState == COMPOUND_TEXT_SINGLE_0) {
                 tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)sourceChar;
             } else {
                 pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[currentState], sourceChar, &pValue, useFallback);
                 if (pValueLength > 0) {
                     for (n = (pValueLength - 1); n >= 0; n--) {
                         tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                     }
                 }
             }

             for (i = 0; i < tmpTargetBufferLength; i++) {
                 if (target < targetLimit) {
                     *target++ = tmpTargetBuffer[i];
                 } else {
                     *err = U_BUFFER_OVERFLOW_ERROR;
                     break;
                 }
             }

             if (*err == U_BUFFER_OVERFLOW_ERROR) {
                 for (; i < tmpTargetBufferLength; i++) {
                     args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = tmpTargetBuffer[i];
                 }
             }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*save the state and return */
    myConverterData->state = currentState;
    args->source = source;
    args->target = (char*)target;
}